

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O0

void N_VDiv_MultiFab(N_Vector x,N_Vector y,N_Vector z)

{
  FabArrayBase *this;
  MultiFab **ppMVar1;
  N_Vector in_RDX;
  N_Vector in_RSI;
  N_Vector in_RDI;
  sunindextype nghost;
  sunindextype ncomp;
  MultiFab *mf_z;
  MultiFab *mf_y;
  MultiFab *mf_x;
  
  ppMVar1 = amrex::sundials::getMFptr(in_RDI);
  this = (FabArrayBase *)*ppMVar1;
  amrex::sundials::getMFptr(in_RSI);
  amrex::sundials::getMFptr(in_RDX);
  amrex::FabArrayBase::nComp(this);
  amrex::MultiFab::Copy
            (_nghost,(MultiFab *)in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
             (int)((ulong)in_RDX >> 0x20),(int)in_RDX);
  amrex::MultiFab::Divide
            (_nghost,(MultiFab *)in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
             (int)((ulong)in_RDX >> 0x20),(int)in_RDX);
  return;
}

Assistant:

void N_VDiv_MultiFab(N_Vector x, N_Vector y, N_Vector z)
{
    amrex::MultiFab *mf_x = amrex::sundials::getMFptr(x);
    amrex::MultiFab *mf_y = amrex::sundials::getMFptr(y);
    amrex::MultiFab *mf_z = amrex::sundials::getMFptr(z);

    sunindextype ncomp = mf_x->nComp();
    //sunindextype nghost = mf_x->nGrow();
    sunindextype nghost = 0;  // do not include ghost cells

    amrex::MultiFab::Copy(*mf_z, *mf_x, 0, 0, ncomp, nghost);
    amrex::MultiFab::Divide(*mf_z, *mf_y, 0, 0, ncomp, nghost);
}